

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckCommand::ProcessAdditionalValues
          (cmCTestMemCheckCommand *this,cmCTestGenericHandler *handler)

{
  cmMakefile *this_00;
  int iVar1;
  reference ppcVar2;
  char *pcVar3;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream str;
  cmCTestGenericHandler *handler_local;
  cmCTestMemCheckCommand *this_local;
  
  ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Values,0x16);
  if (*ppcVar2 != (value_type)0x0) {
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Values,0x16);
    if (**ppcVar2 != '\0') {
      std::__cxx11::ostringstream::ostringstream(local_190);
      iVar1 = cmCTestMemCheckHandler::GetDefectCount((cmCTestMemCheckHandler *)handler);
      std::ostream::operator<<(local_190,iVar1);
      this_00 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
                super_cmCommand.Makefile;
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Values,0x16
                          );
      pcVar3 = *ppcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,pcVar3,&local_1c1);
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,&local_1c0,pcVar3);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
  }
  return;
}

Assistant:

void cmCTestMemCheckCommand::ProcessAdditionalValues(
  cmCTestGenericHandler* handler)
{
  if (this->Values[ctm_DEFECT_COUNT] && *this->Values[ctm_DEFECT_COUNT]) {
    std::ostringstream str;
    str << static_cast<cmCTestMemCheckHandler*>(handler)->GetDefectCount();
    this->Makefile->AddDefinition(this->Values[ctm_DEFECT_COUNT],
                                  str.str().c_str());
  }
}